

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O0

bool duckdb::ColumnCountResult::AddRow(ColumnCountResult *result,idx_t buffer_pos)

{
  bool bVar1;
  idx_t iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  reference pvVar5;
  LinePosition *this;
  unsigned_long in_RSI;
  long in_RDI;
  idx_t i;
  idx_t col_count_idx;
  CSVError error;
  string csv_row;
  bool mock;
  FullLinePosition current_line_position;
  LinesPerBoundary lines_per_batch;
  LinePosition cur_position;
  idx_t in_stack_00000268;
  string *in_stack_00000270;
  CSVReaderOptions *in_stack_00000278;
  LinesPerBoundary in_stack_00000280;
  string *in_stack_000002a0;
  size_type in_stack_fffffffffffffe58;
  CSVError *in_stack_fffffffffffffe60;
  ColumnCountResult *in_stack_fffffffffffffe70;
  undefined1 force_error;
  CSVError *in_stack_fffffffffffffe98;
  ulong uVar6;
  CSVErrorHandler *in_stack_fffffffffffffea0;
  string local_a0 [39];
  undefined1 local_79;
  undefined8 local_78;
  LinesPerBoundary local_40;
  LinePosition local_30;
  unsigned_long local_18;
  long local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  LinePosition::LinePosition
            (&local_30,*(idx_t *)(in_RDI + 0x78),in_RSI + 1,*(idx_t *)(in_RDI + 0x80));
  iVar2 = LinePosition::operator-(&local_30,(LinePosition *)(local_10 + 0x10));
  puVar3 = CSVOption<unsigned_long>::GetValue
                     ((CSVOption<unsigned_long> *)
                      (*(long *)(*(long *)(local_10 + 0x30) + 0x40) + 0x1e8));
  if (*puVar3 < iVar2) {
    uVar4 = NumericLimits<unsigned_long>::Maximum();
    force_error = (undefined1)(iVar2 >> 0x38);
    if (local_18 != uVar4) {
      LinesPerBoundary::LinesPerBoundary(&local_40);
      FullLinePosition::FullLinePosition((FullLinePosition *)in_stack_fffffffffffffe60);
      local_78 = *(undefined8 *)(local_10 + 0x10);
      local_79 = 0;
      FullLinePosition::
      ReconstructCurrentLine<std::map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                ((FullLinePosition *)local_30.buffer_size,(bool *)local_30.buffer_pos,
                 *(map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                   **)(local_10 + 0x20),SUB81((ulong)*(undefined8 *)(local_10 + 0x18) >> 0x38,0));
      in_stack_fffffffffffffe70 = *(ColumnCountResult **)(*(long *)(local_10 + 0x30) + 0x40);
      this = (LinePosition *)(local_10 + 0x10);
      puVar3 = CSVOption<unsigned_long>::GetValue
                         ((CSVOption<unsigned_long> *)
                          (*(long *)(*(long *)(local_10 + 0x30) + 0x40) + 0x290));
      in_stack_fffffffffffffe60 = (CSVError *)LinePosition::GetGlobalPosition(this,*puVar3,false);
      in_stack_fffffffffffffe58 = *(long *)(*(long *)(local_10 + 0x30) + 0x40) + 0x270;
      CSVError::LineSizeError
                (in_stack_00000278,in_stack_00000280,in_stack_00000270,in_stack_00000268,
                 in_stack_000002a0);
      CSVErrorHandler::Error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(bool)force_error);
      *(undefined1 *)(local_10 + 0x60) = 1;
      CSVError::~CSVError(in_stack_fffffffffffffe60);
      ::std::__cxx11::string::~string(local_a0);
    }
  }
  InternalAddRow(in_stack_fffffffffffffe70);
  *(idx_t *)(local_10 + 0x10) = local_30.buffer_pos;
  *(idx_t *)(local_10 + 0x18) = local_30.buffer_size;
  *(idx_t *)(local_10 + 0x20) = local_30.buffer_idx;
  bVar1 = CSVStates::EmptyLastValue(*(CSVStates **)(local_10 + 0x38));
  if (!bVar1) {
    uVar6 = 0;
    while ((uVar6 < *(long *)(local_10 + 0x68) + 1U &&
           (pvVar5 = vector<duckdb::ColumnCount,_true>::operator[]
                               ((vector<duckdb::ColumnCount,_true> *)in_stack_fffffffffffffe60,
                                in_stack_fffffffffffffe58),
           (pvVar5->last_value_always_empty & 1U) != 0))) {
      pvVar5 = vector<duckdb::ColumnCount,_true>::operator[]
                         ((vector<duckdb::ColumnCount,_true> *)in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe58);
      pvVar5->last_value_always_empty = false;
      uVar6 = uVar6 + 1;
    }
  }
  *(long *)(local_10 + 0x68) = *(long *)(local_10 + 0x68) + 1;
  return *(ulong *)(local_10 + 0x28) <= *(ulong *)(local_10 + 0x68);
}

Assistant:

bool ColumnCountResult::AddRow(ColumnCountResult &result, idx_t buffer_pos) {
	const LinePosition cur_position(result.cur_buffer_idx, buffer_pos + 1, result.current_buffer_size);
	if (cur_position - result.last_position > result.state_machine.options.maximum_line_size.GetValue() &&
	    buffer_pos != NumericLimits<idx_t>::Maximum()) {
		LinesPerBoundary lines_per_batch;
		FullLinePosition current_line_position;
		current_line_position.begin = result.last_position;
		current_line_position.end = cur_position;
		bool mock = false;
		string csv_row = current_line_position.ReconstructCurrentLine(mock, result.buffer_handles, true);
		auto error = CSVError::LineSizeError(
		    result.state_machine.options, lines_per_batch, csv_row,
		    result.last_position.GetGlobalPosition(result.state_machine.options.buffer_size_option.GetValue(), false),
		    result.state_machine.options.file_path);
		result.error_handler.Error(error);
		result.error = true;
	}
	result.InternalAddRow();
	result.last_position = cur_position;
	if (!result.states.EmptyLastValue()) {
		idx_t col_count_idx = result.result_position;
		for (idx_t i = 0; i < result.result_position + 1; i++) {
			if (!result.column_counts[col_count_idx].last_value_always_empty) {
				break;
			}
			result.column_counts[col_count_idx--].last_value_always_empty = false;
		}
	}
	result.result_position++;
	if (result.result_position >= result.result_size) {
		// We sniffed enough rows
		return true;
	}
	return false;
}